

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcBlock::IfcBlock(IfcBlock *this)

{
  IfcBlock *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x60,"IfcBlock");
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__00f70728);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBlock,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBlock,_3UL> *)
             &(this->super_IfcCsgPrimitive3D).field_0x38,&PTR_construction_vtable_24__00f707a0);
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf70670;
  *(undefined8 *)&this->field_0x60 = 0xf70710;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf70698;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf706c0;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0xf706e8;
  return;
}

Assistant:

IfcBlock() : Object("IfcBlock") {}